

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,num_writer f)

{
  num_writer nVar1;
  wchar_t wVar2;
  alignment aVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::num_writer>
  local_88;
  undefined1 local_54 [8];
  align_spec as;
  size_t padding;
  ulong uStack_38;
  char_type fill;
  size_t size;
  basic_format_specs<char> *spec_local;
  uint num_digits_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  string_view prefix_local;
  
  nVar1 = f;
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               prefix.data_;
  sVar6 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  uStack_38 = sVar6 + num_digits;
  wVar2 = align_spec::fill(&spec->super_align_spec);
  padding._7_1_ = (char_type)wVar2;
  as.fill_ = L'\0';
  as.align_ = ALIGN_DEFAULT;
  aVar3 = align_spec::align(&spec->super_align_spec);
  if (aVar3 == ALIGN_NUMERIC) {
    uVar4 = align_spec::width(&spec->super_align_spec);
    if (uStack_38 < uVar4) {
      uVar4 = align_spec::width(&spec->super_align_spec);
      as._4_8_ = uVar4 - uStack_38;
      uVar4 = align_spec::width(&spec->super_align_spec);
      uStack_38 = (ulong)uVar4;
    }
  }
  else {
    iVar5 = basic_format_specs<char>::precision(spec);
    if ((int)num_digits < iVar5) {
      sVar6 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
      iVar5 = basic_format_specs<char>::precision(spec);
      uStack_38 = sVar6 + (long)iVar5;
      iVar5 = basic_format_specs<char>::precision(spec);
      as._4_8_ = (long)iVar5 - (ulong)num_digits;
      padding._7_1_ = '0';
    }
  }
  local_54._0_4_ = (spec->super_align_spec).width_;
  local_54._4_4_ = (spec->super_align_spec).fill_;
  as.width_ = (spec->super_align_spec).align_;
  aVar3 = align_spec::align(&spec->super_align_spec);
  if (aVar3 == ALIGN_DEFAULT) {
    as.width_ = 2;
  }
  local_88.prefix.data_ = (char *)this_local;
  local_88.prefix.size_ = (size_t)prefix_local.data_;
  local_88.fill = padding._7_1_;
  local_88.padding._0_4_ = as.fill_;
  local_88.padding._4_4_ = as.align_;
  local_88.f.abs_value = f.abs_value;
  local_88.f.size = f.size;
  f._8_4_ = nVar1._8_4_;
  local_88.f.sep = f.sep;
  local_88.f._9_3_ = f._9_3_;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>>
            (this,uStack_38,(align_spec *)local_54,&local_88);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }